

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::InsertElementInst::InsertElementInst
          (InsertElementInst *this,Value *vec,Value *value,Value *index)

{
  Type *type;
  Value *local_50;
  Value *local_48;
  Value *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  type = Value::getType(vec);
  Instruction::Instruction(&this->super_Instruction,type,InsertElement);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_50 = vec;
  local_48 = value;
  local_40 = index;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38,
             &local_50);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_38);
  return;
}

Assistant:

InsertElementInst::InsertElementInst(Value *vec, Value *value, Value *index)
	: Instruction(vec->getType(), ValueKind::InsertElement)
{
	set_operands({ vec, value, index });
}